

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

float __thiscall
pbrt::PiecewiseLinear2D<3UL>::Evaluate(PiecewiseLinear2D<3UL> *this,Vector2f pos,Float *param)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint32_t i0;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint32_t size;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  float param_weight [6];
  float local_38 [6];
  ulong uVar18;
  
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = pos.super_Tuple2<pbrt::Vector2,_float>;
  pvVar6 = (this->m_param_values).ptr;
  iVar14 = 0;
  lVar13 = 0;
  do {
    uVar3 = this->m_param_size[lVar13];
    if ((ulong)uVar3 == 1) {
      uVar2 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_38 + lVar13 * 2) = uVar2;
    }
    else {
      uVar15 = (ulong)uVar3 - 2;
      lVar16 = 1;
      if (2 < uVar3) {
        lVar16 = 1;
        uVar18 = uVar15;
        do {
          uVar17 = uVar18 >> 1;
          if (pvVar6[lVar13].ptr[uVar17 + lVar16 & 0xffffffff] <= param[lVar13]) {
            lVar16 = uVar17 + 1 + lVar16;
            uVar17 = ~uVar17 + uVar18;
          }
          uVar18 = uVar17;
        } while (0 < (long)uVar17);
      }
      if (lVar16 - 1U < uVar15) {
        uVar15 = lVar16 - 1U;
      }
      if (lVar16 < 1) {
        uVar15 = 0;
      }
      pfVar7 = pvVar6[lVar13].ptr;
      fVar9 = pfVar7[uVar15 & 0xffffffff];
      auVar24 = ZEXT416((uint)((param[lVar13] - fVar9) / (pfVar7[(int)uVar15 + 1] - fVar9)));
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar24);
      uVar2 = vcmpss_avx512f(auVar24,ZEXT816(0) << 0x40,1);
      fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar8._0_4_);
      local_38[lVar13 * 2 + 1] = fVar9;
      local_38[lVar13 * 2] = 1.0 - fVar9;
      iVar14 = (int)uVar15 * this->m_param_strides[lVar13] + iVar14;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  fVar9 = pos.super_Tuple2<pbrt::Vector2,_float>.x *
          (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  auVar8 = vmovshdup_avx(auVar23._0_16_);
  fVar10 = auVar8._0_4_ * (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  iVar11 = (int)fVar9;
  iVar12 = (int)fVar10;
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar5 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  iVar1 = iVar5 + -2;
  if (iVar4 + -2 < iVar11) {
    iVar11 = iVar4 + -2;
  }
  if (iVar1 < iVar12) {
    iVar12 = iVar1;
  }
  fVar9 = fVar9 - (float)iVar11;
  fVar10 = fVar10 - (float)iVar12;
  size = iVar5 * iVar4;
  i0 = iVar14 * size + iVar11 + iVar12 * iVar4;
  fVar19 = lookup<3UL,_0>(this,(this->m_data).ptr,i0,size,local_38);
  fVar20 = lookup<3UL,_0>(this,(this->m_data).ptr + 1,i0,size,local_38);
  fVar21 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x,i0,size,local_38);
  fVar22 = lookup<3UL,_0>(this,(this->m_data).ptr +
                               (long)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.x + 1,i0,size,
                          local_38);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar20)),ZEXT416((uint)(1.0 - fVar9)),
                           ZEXT416((uint)fVar19));
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar22)),ZEXT416((uint)(1.0 - fVar9)),
                            ZEXT416((uint)fVar21));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * fVar10)),auVar8,
                           ZEXT416((uint)(1.0 - fVar10)));
  return (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
         (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y * auVar8._0_4_;
}

Assistant:

PBRT_CPU_GPU
    float Evaluate(Vector2f pos, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;

        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Compute linear interpolation weights */
        pos.x *= m_inv_patch_size.x;
        pos.y *= m_inv_patch_size.y;
        Vector2i offset = Min(Vector2i(pos), m_size - Vector2i(2, 2));

        Vector2f w1 = pos - Vector2f(Vector2i(offset)), w0 = Vector2f(1, 1) - w1;

        uint32_t index = offset.x + offset.y * m_size.x;

        uint32_t size = HProd(m_size);
        if (Dimension != 0)
            index += slice_offset * size;

        float v00 = lookup<Dimension>(m_data.data(), index, size, param_weight),
              v10 = lookup<Dimension>(m_data.data() + 1, index, size, param_weight),
              v01 =
                  lookup<Dimension>(m_data.data() + m_size.x, index, size, param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, index, size,
                                      param_weight);

        return FMA(w0.y, FMA(w0.x, v00, w1.x * v10), w1.y * FMA(w0.x, v01, w1.x * v11)) *
               HProd(m_inv_patch_size);
    }